

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

int Gia_ManFaultAddOne(Gia_Man_t *pM,Cnf_Dat_t *pCnf,sat_solver *pSat,Vec_Int_t *vLits,int nFuncVars
                      ,int fAddOr,Gia_Man_t *pGiaCnf)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *p;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  lit *begin;
  Vec_Int_t *pVVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int Lit;
  uint local_5c;
  int local_58;
  int local_54;
  Vec_Int_t *local_50;
  int local_48;
  int local_44;
  sat_solver *local_40;
  Cnf_Dat_t *local_38;
  
  local_44 = nFuncVars;
  local_38 = pCnf;
  p = Gia_ManFaultCofactor(pM,vLits);
  pAig = Gia_ManToAigSimple(p);
  pAig->nRegs = 0;
  p_00 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Aig_ManStop(pAig);
  iVar5 = sat_solver_nvars(pSat);
  iVar6 = p->nObjs;
  if ((0 < iVar6) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    piVar3 = p_00->pVarNums;
    lVar10 = 0;
    do {
      iVar1 = piVar3[lVar10];
      if (-1 < iVar1) {
        piVar3[lVar10] = iVar1 + iVar5;
        iVar6 = p->nObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar6);
  }
  if (0 < p_00->nLiterals) {
    piVar3 = *p_00->pClauses;
    lVar10 = 0;
    do {
      piVar3[lVar10] = piVar3[lVar10] + iVar5 * 2;
      lVar10 = lVar10 + 1;
    } while (lVar10 < p_00->nLiterals);
  }
  lVar10 = 0;
  do {
    if (p_00->nClauses <= lVar10) {
      if (fAddOr == 0) {
        pVVar7 = p->vCos;
        uVar9 = (ulong)(uint)pVVar7->nSize;
        if (pVVar7->nSize <= p->nRegs) goto LAB_00597893;
        lVar10 = 0;
        goto LAB_00597750;
      }
      local_48 = p->nRegs;
      pVVar7 = p->vCos;
      uVar2 = pVVar7->nSize;
      uVar9 = (ulong)uVar2;
      iVar5 = uVar2 - local_48;
      local_50 = (Vec_Int_t *)malloc(0x10);
      iVar6 = 0x10;
      if (0xe < iVar5 - 1U) {
        iVar6 = iVar5;
      }
      local_50->nSize = 0;
      local_50->nCap = iVar6;
      if (iVar6 == 0) {
        begin = (lit *)0x0;
      }
      else {
        begin = (lit *)malloc((long)iVar6 << 2);
      }
      local_50->pArray = begin;
      if (local_48 < (int)uVar2) {
        lVar10 = 0;
        goto LAB_005977e6;
      }
      lVar10 = 0;
      goto LAB_0059785e;
    }
    iVar6 = sat_solver_addclause(pSat,p_00->pClauses[lVar10],p_00->pClauses[lVar10 + 1]);
    lVar10 = lVar10 + 1;
  } while (iVar6 != 0);
LAB_005976be:
  Cnf_DataFree(p_00);
  Gia_ManStop(p);
  return 0;
  while( true ) {
    if (p_00->pVarNums[iVar6] < 0) goto LAB_00597a47;
    local_54 = p_00->pVarNums[iVar6] * 2 + 1;
    iVar6 = sat_solver_addclause(pSat,&local_54,(lit *)&local_50);
    if (iVar6 == 0) goto LAB_005976be;
    lVar10 = lVar10 + 1;
    pVVar7 = p->vCos;
    uVar9 = (ulong)pVVar7->nSize;
    if ((long)(uVar9 - (long)p->nRegs) <= lVar10) break;
LAB_00597750:
    if ((int)uVar9 <= lVar10) goto LAB_00597a28;
    iVar6 = pVVar7->pArray[lVar10];
    if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00597a09;
    if (p->pObjs == (Gia_Obj_t *)0x0) break;
  }
  goto LAB_00597893;
LAB_005977e6:
  do {
    if ((int)uVar9 <= lVar10) goto LAB_00597a28;
    iVar6 = pVVar7->pArray[lVar10];
    if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00597a09;
    if (p->pObjs == (Gia_Obj_t *)0x0) break;
    if (p_00->pVarNums[iVar6] < 0) {
LAB_00597a47:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    local_54 = p_00->pVarNums[iVar6] * 2;
    Vec_IntPush(local_50,local_54);
    lVar10 = lVar10 + 1;
    pVVar7 = p->vCos;
    uVar9 = (ulong)pVVar7->nSize;
  } while (lVar10 < (long)(uVar9 - (long)p->nRegs));
  begin = local_50->pArray;
  lVar10 = (long)local_50->nSize;
LAB_0059785e:
  iVar6 = sat_solver_addclause(pSat,begin,begin + lVar10);
  if (iVar6 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x447,
                  "int Gia_ManFaultAddOne(Gia_Man_t *, Cnf_Dat_t *, sat_solver *, Vec_Int_t *, int, int, Gia_Man_t *)"
                 );
  }
  if (begin != (lit *)0x0) {
    free(begin);
  }
  free(local_50);
LAB_00597893:
  if (pGiaCnf != (Gia_Man_t *)0x0) {
    iVar6 = pGiaCnf->nRegs;
    pVVar7 = pGiaCnf->vCis;
    iVar5 = pVVar7->nSize;
    if (iVar6 < iVar5) {
      lVar11 = (long)local_44;
      lVar10 = 0;
      local_40 = pSat;
      do {
        if (iVar5 <= lVar10) {
LAB_00597a28:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = pVVar7->pArray[lVar10];
        if (((long)iVar5 < 0) || (pGiaCnf->nObjs <= iVar5)) goto LAB_00597a09;
        if (pGiaCnf->pObjs == (Gia_Obj_t *)0x0) break;
        if (lVar11 <= lVar10) {
          lVar8 = (long)p->vCis->nSize;
          if (lVar8 - p->nRegs <= lVar10) {
            __assert_fail("v < Gia_ManPiNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
          }
          if (lVar8 <= lVar10) goto LAB_00597a28;
          iVar6 = p->vCis->pArray[lVar10];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_00597a09:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar2 = p_00->pVarNums[iVar6];
          if ((int)(uVar2 | local_38->pVarNums[iVar5]) < 0) {
            __assert_fail("iVarA >= 0 && iVarB >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0x16a,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
          }
          uVar4 = local_38->pVarNums[iVar5] * 2;
          local_58 = uVar2 * 2 + 1;
          local_5c = uVar4;
          iVar6 = sat_solver_addclause(pSat,(lit *)&local_5c,&local_54);
          if (iVar6 != 0) {
            local_58 = uVar2 * 2;
            local_5c = uVar4 | 1;
            sat_solver_addclause(local_40,(lit *)&local_5c,&local_54);
          }
          iVar6 = pGiaCnf->nRegs;
          pVVar7 = pGiaCnf->vCis;
          pSat = local_40;
        }
        lVar10 = lVar10 + 1;
        iVar5 = pVVar7->nSize;
      } while (lVar10 < iVar5 - iVar6);
    }
  }
  Cnf_DataFree(p_00);
  Gia_ManStop(p);
  return 1;
}

Assistant:

int Gia_ManFaultAddOne( Gia_Man_t * pM, Cnf_Dat_t * pCnf, sat_solver * pSat, Vec_Int_t * vLits, int nFuncVars, int fAddOr, Gia_Man_t * pGiaCnf )
{
    Gia_Man_t * pC;//, * pTemp;
    Cnf_Dat_t * pCnf2;
    Gia_Obj_t * pObj;
    int i, Lit;
    // derive the cofactor
    pC = Gia_ManFaultCofactor( pM, vLits );
    // derive new CNF
    pCnf2 = Cnf_DeriveGiaRemapped( pC );
    Cnf_DataLiftGia( pCnf2, pC, sat_solver_nvars(pSat) );
    // add timeframe clauses
    for ( i = 0; i < pCnf2->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf2->pClauses[i], pCnf2->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnf2 );
            Gia_ManStop( pC );
            return 0;
        }
    // add constraint clauses
    if ( fAddOr )
    {
        // add one OR gate to assert difference of at least one output of the miter
        Vec_Int_t * vOrGate = Vec_IntAlloc( Gia_ManPoNum(pC) );
        Gia_ManForEachPo( pC, pObj, i )
        {
            Lit = Abc_Var2Lit( pCnf2->pVarNums[Gia_ObjId(pC, pObj)], 0 );
            Vec_IntPush( vOrGate, Lit );
        }
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vOrGate), Vec_IntArray(vOrGate) + Vec_IntSize(vOrGate) ) )
            assert( 0 );
        Vec_IntFree( vOrGate );
    }
    else
    {
        // add negative literals to assert equality of all outputs of the miter
        Gia_ManForEachPo( pC, pObj, i )
        {
            Lit = Abc_Var2Lit( pCnf2->pVarNums[Gia_ObjId(pC, pObj)], 1 );
            if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
            {
                Cnf_DataFree( pCnf2 );
                Gia_ManStop( pC );
                return 0;
            }
        }
    }
    // add connection clauses
    if ( pGiaCnf )
    {
        Gia_ManForEachPi( pGiaCnf, pObj, i )
            if ( i >= nFuncVars )
                sat_solver_add_buffer( pSat, pCnf->pVarNums[Gia_ObjId(pGiaCnf, pObj)], pCnf2->pVarNums[Gia_ObjId(pC, Gia_ManPi(pC, i))], 0 );
    }
    Cnf_DataFree( pCnf2 );
    Gia_ManStop( pC );
    return 1;
}